

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

LPCWSTR __thiscall Js::ScopeVariablesGroupDisplay::Value(ScopeVariablesGroupDisplay *this,int radix)

{
  bool bVar1;
  TypeId TVar2;
  BOOL BVar3;
  int iVar4;
  JavascriptFunction *this_00;
  undefined4 extraout_var;
  StringBuilder<Memory::ArenaAllocator> *this_01;
  ScopeVariablesGroupDisplay *pSVar5;
  FunctionInfo *this_02;
  FunctionBody *pFVar6;
  undefined4 extraout_var_00;
  FunctionBody *functionBody;
  ScopeSlots slotArray;
  JavascriptException *err;
  StringBuilder<Memory::ArenaAllocator> *builder;
  char16 *pDisplayName;
  FunctionBody *pFuncBody;
  JavascriptFunction *calleeFunction;
  Var calleeFunc;
  RecyclableObject *argObject;
  Var local_30;
  Var value;
  RecyclableObject *object;
  ScopeVariablesGroupDisplay *pSStack_18;
  int radix_local;
  ScopeVariablesGroupDisplay *this_local;
  
  object._4_4_ = radix;
  pSStack_18 = this;
  bVar1 = VarIs<Js::ActivationObject>((this->super_RecyclableObjectDisplay).instance);
  if (bVar1) {
    value = VarTo<Js::RecyclableObject>((this->super_RecyclableObjectDisplay).instance);
    local_30 = (Var)0x0;
    TVar2 = RecyclableObject::GetTypeId((RecyclableObject *)value);
    if (((TVar2 == TypeIds_ActivationObject) &&
        (BVar3 = RecyclableObjectDisplay::GetPropertyWithScriptEnter
                           ((RecyclableObject *)value,(RecyclableObject *)value,0x1cf,&local_30,
                            (this->super_RecyclableObjectDisplay).scriptContext), BVar3 != 0)) &&
       (bVar1 = VarIs<Js::RecyclableObject>(local_30), bVar1)) {
      calleeFunc = VarTo<Js::RecyclableObject>(local_30);
      calleeFunction = (JavascriptFunction *)0x0;
      BVar3 = RecyclableObjectDisplay::GetPropertyWithScriptEnter
                        ((RecyclableObject *)calleeFunc,(RecyclableObject *)calleeFunc,0x1ce,
                         &calleeFunction,(this->super_RecyclableObjectDisplay).scriptContext);
      if ((BVar3 != 0) && (bVar1 = VarIs<Js::JavascriptFunction>(calleeFunction), bVar1)) {
        this_00 = VarTo<Js::JavascriptFunction>(calleeFunction);
        pFVar6 = JavascriptFunction::GetFunctionBody(this_00);
        if (pFVar6 != (FunctionBody *)0x0) {
          iVar4 = (*(pFVar6->super_ParseableFunctionInfo).super_FunctionProxy.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])();
          if ((char16 *)CONCAT44(extraout_var,iVar4) != (char16 *)0x0) {
            this_01 = RecyclableObjectDisplay::GetStringBuilder
                                (&this->super_RecyclableObjectDisplay);
            StringBuilder<Memory::ArenaAllocator>::Reset(this_01);
            StringBuilder<Memory::ArenaAllocator>::AppendSz
                      (this_01,(char16 *)CONCAT44(extraout_var,iVar4));
            pSVar5 = (ScopeVariablesGroupDisplay *)
                     StringBuilder<Memory::ArenaAllocator>::Detach(this_01);
            return (LPCWSTR)pSVar5;
          }
        }
      }
    }
    this_local = (ScopeVariablesGroupDisplay *)0x180ca08;
  }
  else {
    ScopeSlots::ScopeSlots
              ((ScopeSlots *)&functionBody,(Type *)(this->super_RecyclableObjectDisplay).instance);
    bVar1 = ScopeSlots::IsDebuggerScopeSlotArray((ScopeSlots *)&functionBody);
    if (bVar1) {
      this_local = (ScopeVariablesGroupDisplay *)0x180ca08;
    }
    else {
      this_02 = ScopeSlots::GetFunctionInfo((ScopeSlots *)&functionBody);
      pFVar6 = FunctionInfo::GetFunctionBody(this_02);
      iVar4 = (*(pFVar6->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
      this_local = (ScopeVariablesGroupDisplay *)CONCAT44(extraout_var_00,iVar4);
    }
  }
  return (LPCWSTR)this_local;
}

Assistant:

LPCWSTR ScopeVariablesGroupDisplay::Value(int radix)
    {
        if (VarIs<ActivationObject>(instance))
        {
            // The scope is defined by the activation object.
            Js::RecyclableObject *object = Js::VarTo<Js::RecyclableObject>(instance);
            try
            {
                // Trying to find out the JavascriptFunction from the scope.
                Var value = nullptr;
                if (object->GetTypeId() == TypeIds_ActivationObject && GetPropertyWithScriptEnter(object, object, PropertyIds::arguments, &value, scriptContext))
                {
                    if (Js::VarIs<Js::RecyclableObject>(value))
                    {
                        Js::RecyclableObject *argObject = Js::VarTo<Js::RecyclableObject>(value);
                        Var calleeFunc = nullptr;
                        if (GetPropertyWithScriptEnter(argObject, argObject, PropertyIds::callee, &calleeFunc, scriptContext) && Js::VarIs<Js::JavascriptFunction>(calleeFunc))
                        {
                            Js::JavascriptFunction *calleeFunction = Js::VarTo<Js::JavascriptFunction>(calleeFunc);
                            Js::FunctionBody *pFuncBody = calleeFunction->GetFunctionBody();

                            if (pFuncBody)
                            {
                                const char16* pDisplayName = pFuncBody->GetDisplayName();
                                if (pDisplayName)
                                {
                                    StringBuilder<ArenaAllocator>* builder = GetStringBuilder();
                                    builder->Reset();
                                    builder->AppendSz(pDisplayName);
                                    return builder->Detach();
                                }
                            }
                        }
                    }
                }
            }
            catch(const JavascriptException& err)
            {
                err.GetAndClear();  // discard exception object
            }

            return _u("");
        }
        else
        {
            // The scope is defined by a slot array object so grab the function body out to get the function name.
            ScopeSlots slotArray = ScopeSlots(reinterpret_cast<Field(Var)*>(instance));

            if(slotArray.IsDebuggerScopeSlotArray())
            {
                // handling for block/catch scope
                return _u("");
            }
            else
            {
                Js::FunctionBody *functionBody = slotArray.GetFunctionInfo()->GetFunctionBody();
                return functionBody->GetDisplayName();
            }
        }
    }